

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

string * __thiscall
deqp::egl::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType)

{
  int iVar1;
  string *psVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ostringstream stream;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar4 = *(long *)this;
  if (*(long *)(this + 8) != lVar4) {
    uVar6 = 0;
    do {
      iVar1 = *(int *)(lVar4 + uVar6 * 4);
      if (iVar1 == 0) {
        lVar4 = 5;
        pcVar5 = "clear";
LAB_0020bb50:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
      }
      else if (iVar1 == 1) {
        lVar4 = 6;
        pcVar5 = "render";
        goto LAB_0020bb50;
      }
      lVar4 = *(long *)this;
      uVar3 = *(long *)(this + 8) - lVar4 >> 2;
      if (uVar6 < uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
        lVar4 = *(long *)this;
        uVar3 = *(long *)(this + 8) - lVar4 >> 2;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

string generateTestName (const vector<DrawType>& frameDrawType)
{
	std::ostringstream stream;

	for (size_t ndx = 0; ndx < frameDrawType.size(); ndx++)
	{
		if (frameDrawType[ndx] == DRAWTYPE_GLES2_RENDER)
			stream << "render";
		else if (frameDrawType[ndx] == DRAWTYPE_GLES2_CLEAR)
			stream << "clear";
		else
			DE_ASSERT(false);

		if (ndx < frameDrawType.size()-1)
			stream << "_";
	}

	return stream.str();
}